

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int c2mir_compile(MIR_context_t ctx,c2mir_options *ops,_func_int_void_ptr *getc_func,void *getc_data
                 ,char *source_name,FILE *output_file)

{
  c2m_ctx_t c2m_ctx;
  pre_ctx *ppVar1;
  c2mir_macro_command *pcVar2;
  VARR_char *varr;
  FILE *pFVar3;
  VARR_char_ptr_t *pVVar4;
  unsigned_long uVar5;
  MIR_context_t pMVar6;
  gen_ctx_conflict *pgVar7;
  type *type;
  func_type *func_type;
  gen_ctx_conflict *pgVar8;
  void *pvVar9;
  check_ctx *pcVar10;
  macro_t pmVar11;
  time_t r2;
  int iVar12;
  int iVar13;
  VARR_pos_t *pVVar14;
  pos_t *ppVar15;
  parse_ctx *ppVar16;
  VARR_stream_t *pVVar17;
  stream_t *ppsVar18;
  pre_ctx *ppVar19;
  tm *__tp;
  size_t sVar20;
  VARR_macro_t *pVVar21;
  macro_t *ppmVar22;
  HTAB_macro_t *pHVar23;
  VARR_HTAB_EL_macro_t *varr_00;
  HTAB_EL_macro_t *pHVar24;
  token_t ptVar25;
  VARR_ifstate_t *pVVar26;
  ifstate_t *ppiVar27;
  VARR_macro_call_t *pVVar28;
  macro_call_t *ppmVar29;
  HTAB_tpname_t *pHVar30;
  VARR_HTAB_EL_tpname_t *varr_01;
  HTAB_EL_tpname_t *pHVar31;
  check_ctx *pcVar32;
  node_t_conflict pnVar33;
  HTAB_symbol_t *pHVar34;
  VARR_HTAB_EL_symbol_t *varr_02;
  HTAB_EL_symbol_t *pHVar35;
  HTAB_case_t *pHVar36;
  VARR_HTAB_EL_case_t *varr_03;
  HTAB_EL_case_t *pHVar37;
  VARR_decl_t *pVVar38;
  decl_t *ppdVar39;
  char_ptr_t *ppcVar40;
  char *pcVar41;
  token_t obj;
  VARR_init_object_t *pVVar42;
  init_object_t *piVar43;
  size_t sVar44;
  node_t_conflict pnVar45;
  node_t_conflict n;
  node_t_conflict pnVar46;
  anon_union_16_10_0af5b411_for_u *paVar47;
  c2mir_options *pcVar48;
  MIR_module_t_conflict module;
  gen_ctx_conflict *pgVar49;
  HTAB_reg_var_t *pHVar50;
  VARR_HTAB_EL_reg_var_t *pVVar51;
  HTAB_EL_reg_var_t *pHVar52;
  VARR_MIR_var_t *pVVar53;
  MIR_var_t *pMVar54;
  VARR_MIR_type_t *pVVar55;
  MIR_type_t *pMVar56;
  HTAB_MIR_item_t *pHVar57;
  VARR_HTAB_EL_MIR_item_t *pVVar58;
  HTAB_EL_MIR_item_t *pHVar59;
  code *pcVar60;
  size_t sVar61;
  htab_ind_t *phVar62;
  VARR_case_t *pVVar63;
  case_t_conflict *ppcVar64;
  VARR_init_el_t *pVVar65;
  init_el_t *piVar66;
  node_t id;
  size_t i;
  ulong uVar67;
  char *pcVar68;
  node_t pnVar69;
  MIR_item_t_conflict *ppMVar70;
  pre_ctx_t pre_ctx;
  node *r;
  undefined8 uVar71;
  size_t i_1;
  long lVar72;
  size_t i_2;
  VARR_node_t **ppVVar73;
  bool bVar74;
  double dVar75;
  double dVar76;
  pos_t pos;
  pos_t pos_00;
  pos_t pVar77;
  MIR_item *el;
  uint local_19c;
  check_ctx *local_198;
  pre_ctx *local_190;
  node_t_conflict local_188;
  VARR_node_t **local_180;
  macro macro;
  MIR_proto p;
  macro_t tab_m;
  VARR_token_t *pVStack_e0;
  int64_t iStack_d8;
  char *pcStack_d0;
  undefined8 uStack_c8;
  MIR_disp_t MStack_c0;
  time_t t;
  VARR_token_t *pVStack_b0;
  int64_t iStack_a8;
  char *pcStack_a0;
  undefined8 uStack_98;
  MIR_disp_t MStack_90;
  char local_88 [32];
  time_t time_loc;
  VARR_token_t *pVStack_60;
  int64_t iStack_58;
  char *pcStack_50;
  undefined8 uStack_48;
  MIR_disp_t MStack_40;
  
  c2m_ctx = (c2m_ctx_t)ctx->c2mir_ctx;
  pcVar48 = ops;
  dVar75 = real_usec_time();
  if (c2m_ctx != (c2m_ctx_t)0x0) {
    iVar12 = _setjmp((__jmp_buf_tag *)c2m_ctx->env);
    if (iVar12 == 0) {
      c2m_ctx->options = ops;
      c2m_ctx->n_errors = 0;
      c2m_ctx->n_warnings = 0;
      c2m_ctx->c_getc = getc_func;
      c2m_ctx->c_getc_data = getc_data;
      VARR_charcreate(&c2m_ctx->symbol_text,(size_t)pcVar48);
      VARR_charcreate(&c2m_ctx->temp_string,(size_t)pcVar48);
      pcVar41 = &DAT_00000018;
      pVVar14 = (VARR_pos_t *)malloc(0x18);
      c2m_ctx->node_positions = pVVar14;
      if (pVVar14 != (VARR_pos_t *)0x0) {
        pVVar14->els_num = 0;
        pVVar14->size = 0x80;
        ppVar15 = (pos_t *)malloc(0x800);
        pVVar14->varr = ppVar15;
        ppVar16 = (parse_ctx *)c2mir_calloc(c2m_ctx,0x28);
        c2m_ctx->parse_ctx = ppVar16;
        ppVar16->curr_scope = (node_t_conflict)0x0;
        c2m_ctx->error_func = fatal_error;
        ppVar16->record_level = 0;
        c2m_ctx->curr_uid = 0;
        pcVar41 = &DAT_00000018;
        pVVar17 = (VARR_stream_t *)malloc(0x18);
        c2m_ctx->cs = (stream_t)0x0;
        c2m_ctx->eof_s = (stream_t)0x0;
        c2m_ctx->streams = pVVar17;
        if (pVVar17 != (VARR_stream_t *)0x0) {
          pVVar17->els_num = 0;
          pVVar17->size = 0x20;
          ppsVar18 = (stream_t *)malloc(0x100);
          pVVar17->varr = ppsVar18;
          VARR_token_tcreate(&c2m_ctx->recorded_tokens,0x20);
          VARR_token_tcreate(&c2m_ctx->buffered_tokens,0x20);
          ppVar19 = (pre_ctx *)c2mir_calloc(c2m_ctx,0x140);
          c2m_ctx->pre_ctx = ppVar19;
          ppVar19->no_out_p = 0;
          ppVar19->skip_if_part_p = 0;
          t = time(&time_loc);
          __tp = localtime_r(&t,(tm *)&macro);
          if (__tp == (tm *)0x0) {
            builtin_strncpy(ppVar19->date_str_repr,"\"Unknown date\"",0xf);
            builtin_strncpy(ppVar19->time_str_repr,"\"Unknown time\"",0xf);
          }
          else {
            strftime(ppVar19->date_str_repr,0x32,"\"%b %d %Y\"",__tp);
            strftime(ppVar19->time_str_repr,0x32,"\"%H:%M:%S\"",__tp);
          }
          strcpy(ppVar19->date_str,ppVar19->date_str_repr + 1);
          sVar20 = strlen(ppVar19->date_str);
          ppVar19->date_str[sVar20 - 1] = '\0';
          strcpy(ppVar19->time_str,ppVar19->time_str_repr + 1);
          sVar20 = strlen(ppVar19->time_str);
          ppVar19->date_str[sVar20 + 0x31] = '\0';
          VARR_char_ptr_tcreate((VARR_char_ptr_t **)ppVar19,0x40);
          VARR_token_tcreate(&ppVar19->temp_tokens,0x80);
          VARR_token_tcreate(&ppVar19->output_buffer,0x800);
          ppVar1 = c2m_ctx->pre_ctx;
          pcVar41 = &DAT_00000018;
          pVVar21 = (VARR_macro_t *)malloc(0x18);
          ppVar1->macros = pVVar21;
          if (pVVar21 != (VARR_macro_t *)0x0) {
            pVVar21->els_num = 0;
            pVVar21->size = 0x800;
            ppmVar22 = (macro_t *)malloc(0x4000);
            pVVar21->varr = ppmVar22;
            pcVar41 = (char *)0x40;
            pHVar23 = (HTAB_macro_t *)malloc(0x40);
            if (pHVar23 == (HTAB_macro_t *)0x0) goto LAB_0014bcef;
            pcVar41 = &DAT_00000018;
            varr_00 = (VARR_HTAB_EL_macro_t *)malloc(0x18);
            pHVar23->els = varr_00;
            if (varr_00 != (VARR_HTAB_EL_macro_t *)0x0) {
              varr_00->els_num = 0;
              varr_00->size = 0x800;
              pHVar24 = (HTAB_EL_macro_t *)malloc(0x8000);
              varr_00->varr = pHVar24;
              VARR_HTAB_EL_macro_ttailor(varr_00,0x800);
              uVar71 = 0x1000;
              VARR_htab_ind_tcreate(&pHVar23->entries,0x1000);
              pHVar23->arg = (void *)0x0;
              iVar12 = 0x1000;
              pHVar23->hash_func = macro_hash;
              pHVar23->eq_func = macro_eq;
              pHVar23->free_func = (_func_void_macro_t_void_ptr *)0x0;
              pHVar23->els_num = 0;
              pHVar23->els_start = 0;
              pHVar23->els_bound = 0;
              pHVar23->collisions = 0;
              while (bVar74 = iVar12 != 0, iVar12 = iVar12 + -1, bVar74) {
                VARR_htab_ind_tpush(pHVar23->entries,(htab_ind_t)uVar71);
              }
              ppVar1->macro_tab = pHVar23;
              new_std_macro(c2m_ctx,"__DATE__");
              new_std_macro(c2m_ctx,"__TIME__");
              new_std_macro(c2m_ctx,"__FILE__");
              new_std_macro(c2m_ctx,"__LINE__");
              if (c2m_ctx->options->pedantic_p == 0) {
                VARR_token_tcreate((VARR_token_t **)&tab_m,1);
                pmVar11 = tab_m;
                ptVar25 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"$");
                VARR_token_tpush((VARR_token_t *)pmVar11,ptVar25);
                ptVar25 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),
                                       "__has_include");
                new_macro(c2m_ctx,ptVar25,(VARR_token_t *)pmVar11,(VARR_token_t *)0x0);
                VARR_token_tcreate((VARR_token_t **)&tab_m,1);
                pmVar11 = tab_m;
                ptVar25 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),"$");
                VARR_token_tpush((VARR_token_t *)pmVar11,ptVar25);
                ptVar25 = new_id_token(c2m_ctx,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40),
                                       "__has_builtin");
                new_macro(c2m_ctx,ptVar25,(VARR_token_t *)pmVar11,(VARR_token_t *)0x0);
              }
              pcVar41 = &DAT_00000018;
              pVVar26 = (VARR_ifstate_t *)malloc(0x18);
              ppVar19->ifs = pVVar26;
              if (pVVar26 != (VARR_ifstate_t *)0x0) {
                pVVar26->els_num = 0;
                pVVar26->size = 0x200;
                ppiVar27 = (ifstate_t *)malloc(0x1000);
                pVVar26->varr = ppiVar27;
                pcVar41 = &DAT_00000018;
                pVVar28 = (VARR_macro_call_t *)malloc(0x18);
                ppVar19->macro_call_stack = pVVar28;
                if (pVVar28 != (VARR_macro_call_t *)0x0) {
                  pVVar28->els_num = 0;
                  pVVar28->size = 0x200;
                  ppmVar29 = (macro_call_t *)malloc(0x1000);
                  pVVar28->varr = ppmVar29;
                  kw_add(c2m_ctx,"_Bool",T_BOOL,0);
                  kw_add(c2m_ctx,"_Complex",T_COMPLEX,0);
                  kw_add(c2m_ctx,"_Alignas",T_ALIGNAS,0);
                  kw_add(c2m_ctx,"_Alignof",T_ALIGNOF,0);
                  kw_add(c2m_ctx,"_Atomic",T_ATOMIC,0);
                  kw_add(c2m_ctx,"_Generic",T_GENERIC,0);
                  kw_add(c2m_ctx,"_Noreturn",T_NO_RETURN,0);
                  kw_add(c2m_ctx,"_Static_assert",T_STATIC_ASSERT,0);
                  kw_add(c2m_ctx,"_Thread_local",T_THREAD_LOCAL,0);
                  kw_add(c2m_ctx,"auto",T_AUTO,0);
                  kw_add(c2m_ctx,"break",T_BREAK,0);
                  kw_add(c2m_ctx,"case",T_CASE,0);
                  kw_add(c2m_ctx,"char",T_CHAR,0);
                  kw_add(c2m_ctx,"const",T_CONST,0);
                  kw_add(c2m_ctx,"continue",T_CONTINUE,0);
                  kw_add(c2m_ctx,"default",T_DEFAULT,0);
                  kw_add(c2m_ctx,"do",T_DO,0);
                  kw_add(c2m_ctx,"double",T_DOUBLE,0);
                  kw_add(c2m_ctx,"else",T_ELSE,0);
                  kw_add(c2m_ctx,"enum",T_ENUM,0);
                  kw_add(c2m_ctx,"extern",T_EXTERN,0);
                  kw_add(c2m_ctx,"float",T_FLOAT,0);
                  kw_add(c2m_ctx,"for",T_FOR,0);
                  kw_add(c2m_ctx,"goto",T_GOTO,0);
                  kw_add(c2m_ctx,"if",T_IF,0);
                  kw_add(c2m_ctx,"inline",T_INLINE,3);
                  kw_add(c2m_ctx,"int",T_INT,0);
                  kw_add(c2m_ctx,"long",T_LONG,0);
                  kw_add(c2m_ctx,"register",T_REGISTER,0);
                  kw_add(c2m_ctx,"restrict",T_RESTRICT,2);
                  kw_add(c2m_ctx,"return",T_RETURN,0);
                  kw_add(c2m_ctx,"short",T_SHORT,0);
                  kw_add(c2m_ctx,"signed",T_SIGNED,0);
                  kw_add(c2m_ctx,"sizeof",T_SIZEOF,0);
                  kw_add(c2m_ctx,"static",T_STATIC,0);
                  kw_add(c2m_ctx,"struct",T_STRUCT,0);
                  kw_add(c2m_ctx,"switch",T_SWITCH,0);
                  kw_add(c2m_ctx,"typedef",T_TYPEDEF,0);
                  kw_add(c2m_ctx,"typeof",T_TYPEOF,1);
                  kw_add(c2m_ctx,"union",T_UNION,0);
                  kw_add(c2m_ctx,"unsigned",T_UNSIGNED,0);
                  kw_add(c2m_ctx,"void",T_VOID,0);
                  kw_add(c2m_ctx,"volatile",T_VOLATILE,0);
                  kw_add(c2m_ctx,"while",T_WHILE,0);
                  kw_add(c2m_ctx,"__restrict",T_RESTRICT,1);
                  kw_add(c2m_ctx,"__restrict__",T_RESTRICT,1);
                  kw_add(c2m_ctx,"__inline",T_INLINE,1);
                  kw_add(c2m_ctx,"__inline__",T_INLINE,1);
                  ppVar16 = c2m_ctx->parse_ctx;
                  pcVar41 = (char *)0x40;
                  pHVar30 = (HTAB_tpname_t *)malloc(0x40);
                  if (pHVar30 == (HTAB_tpname_t *)0x0) {
LAB_0014bcef:
                    mir_htab_error(pcVar41);
                  }
                  pcVar41 = &DAT_00000018;
                  varr_01 = (VARR_HTAB_EL_tpname_t *)malloc(0x18);
                  pHVar30->els = varr_01;
                  if (varr_01 != (VARR_HTAB_EL_tpname_t *)0x0) {
                    varr_01->els_num = 0;
                    varr_01->size = 0x400;
                    pHVar31 = (HTAB_EL_tpname_t *)malloc(0x8000);
                    varr_01->varr = pHVar31;
                    VARR_HTAB_EL_tpname_ttailor(varr_01,0x400);
                    uVar71 = 0x800;
                    VARR_htab_ind_tcreate(&pHVar30->entries,0x800);
                    pHVar30->arg = (void *)0x0;
                    iVar12 = 0x800;
                    pHVar30->hash_func = tpname_hash;
                    pHVar30->eq_func = tpname_eq;
                    pHVar30->free_func = (_func_void_tpname_t_void_ptr *)0x0;
                    pHVar30->els_num = 0;
                    pHVar30->els_start = 0;
                    pHVar30->els_bound = 0;
                    pHVar30->collisions = 0;
                    while (bVar74 = iVar12 != 0, iVar12 = iVar12 + -1, bVar74) {
                      VARR_htab_ind_tpush(pHVar30->entries,(htab_ind_t)uVar71);
                    }
                    ppVar16->tpname_tab = pHVar30;
                    pcVar32 = (check_ctx *)c2mir_calloc(c2m_ctx,0x78);
                    c2m_ctx->check_ctx = pcVar32;
                    pnVar33 = new_i_node(c2m_ctx,1,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40));
                    pcVar32->n_i1_node = pnVar33;
                    pcVar41 = (char *)0x40;
                    VARR_node_tcreate(&pcVar32->context_stack,0x40);
                    check(c2m_ctx,pcVar32->n_i1_node,(node_t_conflict)0x0);
                    pcVar32->curr_scope = (node_t_conflict)0x0;
                    pcVar32->func_block_scope = (node_t_conflict)0x0;
                    VARR_node_tcreate(&pcVar32->label_uses,0);
                    pHVar34 = (HTAB_symbol_t *)malloc(0x40);
                    if (pHVar34 == (HTAB_symbol_t *)0x0) goto LAB_0014bcef;
                    pcVar41 = &DAT_00000018;
                    varr_02 = (VARR_HTAB_EL_symbol_t *)malloc(0x18);
                    pHVar34->els = varr_02;
                    if (varr_02 != (VARR_HTAB_EL_symbol_t *)0x0) {
                      varr_02->els_num = 0;
                      varr_02->size = 0x2000;
                      local_198 = pcVar32;
                      pHVar35 = (HTAB_EL_symbol_t *)malloc(0x70000);
                      varr_02->varr = pHVar35;
                      VARR_HTAB_EL_symbol_ttailor(varr_02,0x2000);
                      uVar71 = 0x4000;
                      VARR_htab_ind_tcreate(&pHVar34->entries,0x4000);
                      pHVar34->arg = (void *)0x0;
                      iVar12 = 0x4000;
                      pHVar34->hash_func = symbol_hash;
                      pHVar34->eq_func = symbol_eq;
                      pHVar34->free_func = symbol_clear;
                      pHVar34->els_num = 0;
                      pHVar34->els_start = 0;
                      pHVar34->els_bound = 0;
                      pHVar34->collisions = 0;
                      while (bVar74 = iVar12 != 0, iVar12 = iVar12 + -1, bVar74) {
                        VARR_htab_ind_tpush(pHVar34->entries,(htab_ind_t)uVar71);
                      }
                      c2m_ctx->symbol_tab = pHVar34;
                      local_198->in_params_p = '\0';
                      local_198->curr_unnamed_anon_struct_union_member = (node_t_conflict)0x0;
                      pcVar41 = (char *)0x40;
                      pHVar36 = (HTAB_case_t *)malloc(0x40);
                      if (pHVar36 == (HTAB_case_t *)0x0) goto LAB_0014bcef;
                      pcVar41 = &DAT_00000018;
                      varr_03 = (VARR_HTAB_EL_case_t *)malloc(0x18);
                      pHVar36->els = varr_03;
                      if (varr_03 != (VARR_HTAB_EL_case_t *)0x0) {
                        varr_03->els_num = 0;
                        varr_03->size = 0x80;
                        pHVar37 = (HTAB_EL_case_t *)malloc(0x800);
                        varr_03->varr = pHVar37;
                        VARR_HTAB_EL_case_ttailor(varr_03,0x80);
                        uVar71 = 0x100;
                        VARR_htab_ind_tcreate(&pHVar36->entries,0x100);
                        pHVar36->arg = (void *)0x0;
                        iVar12 = 0x100;
                        pHVar36->hash_func = case_hash;
                        pHVar36->eq_func = case_eq;
                        pHVar36->free_func = (_func_void_case_t_void_ptr *)0x0;
                        pHVar36->els_num = 0;
                        pHVar36->els_start = 0;
                        pHVar36->els_bound = 0;
                        pHVar36->collisions = 0;
                        while (pcVar10 = local_198, bVar74 = iVar12 != 0, iVar12 = iVar12 + -1,
                              bVar74) {
                          VARR_htab_ind_tpush(pHVar36->entries,(htab_ind_t)uVar71);
                        }
                        local_198->case_tab = pHVar36;
                        pcVar41 = &DAT_00000018;
                        pVVar38 = (VARR_decl_t *)malloc(0x18);
                        pcVar10->func_decls_for_allocation = pVVar38;
                        if (pVVar38 != (VARR_decl_t *)0x0) {
                          pVVar38->els_num = 0;
                          pVVar38->size = 0x400;
                          ppdVar39 = (decl_t *)malloc(0x2000);
                          pVVar38->varr = ppdVar39;
                          VARR_node_tcreate(&pcVar32->possible_incomplete_decls,0x200);
                          uVar67 = 0;
                          VARR_char_ptr_tcreate(&c2m_ctx->headers,0);
                          VARR_char_ptr_tcreate(&c2m_ctx->system_headers,0);
                          while( true ) {
                            if (c2m_ctx->options->include_dirs_num <= uVar67) break;
                            VARR_char_ptr_tpush(c2m_ctx->headers,
                                                c2m_ctx->options->include_dirs[uVar67]);
                            VARR_char_ptr_tpush(c2m_ctx->system_headers,
                                                c2m_ctx->options->include_dirs[uVar67]);
                            uVar67 = uVar67 + 1;
                          }
                          VARR_char_ptr_tpush(c2m_ctx->headers,(char_ptr_t)0x0);
                          VARR_char_ptr_tpush(c2m_ctx->system_headers,"/usr/local/include");
                          VARR_char_ptr_tpush(c2m_ctx->system_headers,
                                              "/usr/include/x86_64-linux-gnu");
                          VARR_char_ptr_tpush(c2m_ctx->system_headers,"/usr/include");
                          VARR_char_ptr_tpush(c2m_ctx->system_headers,(char_ptr_t)0x0);
                          ppcVar40 = VARR_char_ptr_taddr(c2m_ctx->headers);
                          c2m_ctx->header_dirs = ppcVar40;
                          ppcVar40 = VARR_char_ptr_taddr(c2m_ctx->system_headers);
                          c2m_ctx->system_header_dirs = ppcVar40;
                          for (uVar67 = 0; uVar67 < c2m_ctx->options->macro_commands_num;
                              uVar67 = uVar67 + 1) {
                            pcVar2 = c2m_ctx->options->macro_commands;
                            ppVar19 = c2m_ctx->pre_ctx;
                            pcVar41 = pcVar2[uVar67].name;
                            pcVar68 = pcVar2[uVar67].def;
                            if (pcVar68 == (char *)0x0) {
                              pVar77.lno = 1;
                              pVar77.ln_pos = 0;
                              pVar77.fname = "<command-line>";
                              ptVar25 = new_id_token(c2m_ctx,pVar77,pcVar41);
                              iVar12 = check_id_p(c2m_ctx,ptVar25->repr);
                              if (iVar12 != 0) {
                                macro.id = ptVar25;
                                HTAB_macro_t_do(ppVar19->macro_tab,&macro,HTAB_DELETE,&tab_m);
                              }
                            }
                            else {
                              local_190 = ppVar19;
                              VARR_token_tcreate((VARR_token_t **)&t,0x10);
                              pos_00.lno = 1;
                              pos_00.ln_pos = 0;
                              pos_00.fname = "<command-line>";
                              ptVar25 = new_id_token(c2m_ctx,pos_00,pcVar41);
                              VARR_chartrunc(c2m_ctx->temp_string,0);
                              while( true ) {
                                varr = c2m_ctx->temp_string;
                                if (*pcVar68 == '\0') break;
                                VARR_charpush(varr,*pcVar68);
                                pcVar68 = pcVar68 + 1;
                              }
                              VARR_charpush(varr,'\0');
                              reverse(c2m_ctx->temp_string);
                              pcVar41 = VARR_charaddr(c2m_ctx->temp_string);
                              pos.lno = 1;
                              pos.ln_pos = 0;
                              pos.fname = "<command-line>";
                              set_string_stream(c2m_ctx,pcVar41,pos,
                                                (_func_void_char_ptr_VARR_char_ptr *)0x0);
                              r2 = t;
                              while( true ) {
                                obj = get_next_pptoken(c2m_ctx);
                                if ((*(short *)obj == 0x13d) || (*(short *)obj == 0x147)) break;
                                VARR_token_tpush((VARR_token_t *)r2,obj);
                              }
                              iVar12 = check_id_p(c2m_ctx,ptVar25->repr);
                              if (iVar12 != 0) {
                                macro.id = ptVar25;
                                iVar12 = HTAB_macro_t_do(local_190->macro_tab,&macro,HTAB_FIND,
                                                         &tab_m);
                                if (iVar12 != 0) {
                                  iVar12 = replacement_eq_p(tab_m->replacement,(VARR_token_t *)r2);
                                  if ((iVar12 == 0) &&
                                     (pFVar3 = (FILE *)c2m_ctx->options->message_file,
                                     pFVar3 != (FILE *)0x0)) {
                                    fprintf(pFVar3,
                                            "warning -- redefinition of macro %s on the command line\n"
                                            ,ptVar25->repr);
                                  }
                                  HTAB_macro_t_do(local_190->macro_tab,&macro,HTAB_DELETE,&tab_m);
                                }
                                new_macro(c2m_ctx,macro.id,(VARR_token_t *)0x0,(VARR_token_t *)r2);
                              }
                            }
                          }
                          local_180 = &c2m_ctx->call_nodes;
                          VARR_node_tcreate(local_180,0x80);
                          lVar72 = 8;
                          VARR_node_tcreate(&c2m_ctx->containing_anon_members,8);
                          pcVar41 = &DAT_00000018;
                          pVVar42 = (VARR_init_object_t *)malloc(0x18);
                          c2m_ctx->init_object_path = pVVar42;
                          if (pVVar42 != (VARR_init_object_t *)0x0) {
                            pVVar42->els_num = 0;
                            pVVar42->size = 8;
                            piVar43 = (init_object_t *)malloc(0xc0);
                            pVVar42->varr = piVar43;
                            if ((c2m_ctx->options->verbose_p != 0) &&
                               (pFVar3 = (FILE *)c2m_ctx->options->message_file,
                               pFVar3 != (FILE *)0x0)) {
                              real_usec_time();
                              fprintf(pFVar3,"C2MIR init end           -- %.0f usec\n");
                            }
                            add_stream(c2m_ctx,(FILE *)0x0,source_name,top_level_getc);
                            if (c2m_ctx->options->no_prepro_p == 0) {
                              for (; lVar72 != 0xb8; lVar72 = lVar72 + 0x10) {
                                if (*(long *)(&UNK_001a7ce8 + lVar72) == 0) {
                                  add_string_stream(c2m_ctx,"<environment>",
                                                    *(char **)((long)&standard_includes[0].name +
                                                              lVar72));
                                }
                              }
                            }
                            ppVar19 = c2m_ctx->pre_ctx;
                            ppVar19->pre_last_token = (token_t)0x0;
                            (ppVar19->actual_pre_pos).fname = (char *)0x0;
                            (ppVar19->actual_pre_pos).lno = 0;
                            (ppVar19->actual_pre_pos).ln_pos = 0;
                            ppVar19->pptokens_num = 0;
                            ppVar19->pre_out_token_func = common_pre_out;
                            pVVar4 = ppVar19->once_include_files;
                            if ((pVVar4 == (VARR_char_ptr_t *)0x0) ||
                               (pVVar4->varr == (char_ptr_t *)0x0)) {
                              mir_varr_assert_fail("trunc","char_ptr_t");
                            }
                            pVVar4->els_num = 0;
                            if (c2m_ctx->options->no_prepro_p == 0) {
                              processing(c2m_ctx,0);
                            }
                            else {
                              while( true ) {
                                ptVar25 = get_next_pptoken(c2m_ctx);
                                if ((*(short *)ptVar25 == 0x13d) || (*(short *)ptVar25 == 0x147))
                                break;
                                (*ppVar19->pre_out_token_func)(c2m_ctx,ptVar25);
                              }
                            }
                            (*ppVar19->pre_out_token_func)(c2m_ctx,(token_t)0x0);
                            pcVar48 = c2m_ctx->options;
                            if ((pcVar48->verbose_p != 0) &&
                               (pFVar3 = (FILE *)pcVar48->message_file, pFVar3 != (FILE *)0x0)) {
                              uVar5 = ppVar19->pptokens_num;
                              sVar44 = VARR_token_tlength(c2m_ctx->recorded_tokens);
                              fprintf(pFVar3,"    preprocessor tokens -- %lu, parse tokens -- %lu\n"
                                      ,uVar5,sVar44);
                              pcVar48 = c2m_ctx->options;
                              if ((pcVar48->verbose_p != 0) &&
                                 (pFVar3 = (FILE *)pcVar48->message_file, pFVar3 != (FILE *)0x0)) {
                                dVar76 = real_usec_time();
                                fprintf(pFVar3,"  C2MIR preprocessor end    -- %.0f usec\n",
                                        dVar76 - dVar75);
                                pcVar48 = c2m_ctx->options;
                              }
                            }
                            if (pcVar48->prepro_only_p == 0) {
                              ppVar16 = c2m_ctx->parse_ctx;
                              ppVar16->next_token_index = 0;
                              read_token(c2m_ctx);
                              pnVar33 = new_node(c2m_ctx,N_LIST);
                              local_188 = pnVar33;
                              while (*(short *)ppVar16->curr_token != 0x13d) {
                                pnVar45 = try_f(c2m_ctx,declaration);
                                if (pnVar45 == &err_struct) {
                                  pnVar45 = declaration_specs(c2m_ctx,0,(node_t_conflict)0x1);
                                  if ((pnVar45 != &err_struct) &&
                                     (n = declarator(c2m_ctx,0), n != &err_struct)) {
                                    pnVar33 = new_node(c2m_ctx,N_LIST);
                                    n->attr = ppVar16->curr_scope;
                                    ppVar16->curr_scope = n;
                                    while (*(short *)ppVar16->curr_token != 0x7b) {
                                      pnVar46 = declaration(c2m_ctx,0);
                                      if (pnVar46 == &err_struct) {
                                        ppVar16->curr_scope = (node_t_conflict)n->attr;
                                        pnVar33 = local_188;
                                        goto LAB_0014afcd;
                                      }
                                      op_flat_append(c2m_ctx,pnVar33,pnVar46);
                                    }
                                    pnVar46 = DLIST_node_t_el(&(n->u).ops,1);
                                    pnVar69 = (pnVar46->u).ops.head;
                                    if ((pnVar69 == (node_t)0x0) || (pnVar69->code != N_FUNC)) {
                                      pnVar46 = (n->u).ops.head;
                                      pVar77 = get_node_pos(c2m_ctx,pnVar46);
                                      error(c2m_ctx,0x18e7be,pVar77.fname,pVar77._8_8_,
                                            (pnVar46->u).s.s);
                                    }
                                    else {
                                      paVar47 = &((pnVar69->u).ops.head)->u;
                                      while (pnVar69 = (paVar47->ops).head, pnVar69 != (node_t)0x0)
                                      {
                                        if (pnVar69->code == N_SPEC_DECL) {
                                          pnVar46 = DLIST_node_t_el(&(pnVar69->u).ops,1);
                                          id = (pnVar46->u).ops.head;
                                          pnVar46 = ppVar16->curr_scope;
LAB_0014afac:
                                          tpname_add((tpname_t *)&macro,c2m_ctx,id,pnVar46,0);
                                        }
                                        else if (pnVar69->code == N_ID) {
                                          pnVar46 = ppVar16->curr_scope;
                                          id = pnVar69;
                                          goto LAB_0014afac;
                                        }
                                        paVar47 = (anon_union_16_10_0af5b411_for_u *)
                                                  &(pnVar69->op_link).next;
                                      }
                                    }
                                    pcVar41 = (char *)0x0;
                                    pnVar46 = compound_stmt(c2m_ctx,0);
                                    if (pnVar46 != &err_struct) {
                                      pVar77 = get_node_pos(c2m_ctx,n);
                                      pnVar45 = new_pos_node4(c2m_ctx,N_FUNC_DEF,pVar77,pnVar45,n,
                                                              pnVar33,pnVar46);
                                      ppVar16->curr_scope = (node_t_conflict)n->attr;
                                      pnVar33 = local_188;
                                      goto LAB_0014ae8c;
                                    }
                                    r = &err_struct;
                                    goto LAB_0014b094;
                                  }
LAB_0014afcd:
                                  error_recovery(c2m_ctx,0,"<declarator>");
                                }
                                else {
LAB_0014ae8c:
                                  op_flat_append(c2m_ctx,pnVar33,pnVar45);
                                }
                              }
                              pcVar41 = (char *)0x7e;
                              r = new_node1(c2m_ctx,N_MODULE,pnVar33);
LAB_0014b094:
                              pcVar48 = c2m_ctx->options;
                              if ((pcVar48->verbose_p != 0) &&
                                 (pFVar3 = (FILE *)pcVar48->message_file, pFVar3 != (FILE *)0x0)) {
                                dVar76 = real_usec_time();
                                pcVar41 = "  C2MIR parser end          -- %.0f usec\n";
                                fprintf(pFVar3,"  C2MIR parser end          -- %.0f usec\n",
                                        dVar76 - dVar75);
                                pcVar48 = c2m_ctx->options;
                                if ((pcVar48->verbose_p != 0) &&
                                   (((FILE *)pcVar48->message_file != (FILE *)0x0 &&
                                    (c2m_ctx->n_errors != 0)))) {
                                  pcVar41 = (char *)0xe;
                                  fwrite("parser - FAIL\n",0xe,1,(FILE *)pcVar48->message_file);
                                  pcVar48 = c2m_ctx->options;
                                }
                              }
                              if (pcVar48->syntax_only_p == 0) {
                                local_19c = c2m_ctx->n_errors;
                                pcVar32 = c2m_ctx->check_ctx;
                                VARR_node_ttrunc(c2m_ctx->call_nodes,(size_t)pcVar41);
                                VARR_node_ttrunc(pcVar32->possible_incomplete_decls,(size_t)pcVar41)
                                ;
                                check(c2m_ctx,r,(node_t_conflict)0x0);
                                for (uVar67 = 0;
                                    sVar44 = VARR_node_tlength(pcVar32->possible_incomplete_decls),
                                    uVar67 < sVar44; uVar67 = uVar67 + 1) {
                                  pnVar33 = VARR_node_tget(pcVar32->possible_incomplete_decls,uVar67
                                                          );
                                  iVar12 = incomplete_type_p(c2m_ctx,*(type **)((long)pnVar33->attr
                                                                               + 0x40));
                                  if (iVar12 != 0) {
                                    pVar77 = get_node_pos(c2m_ctx,pnVar33);
                                    error(c2m_ctx,0x18ec0c,pVar77.fname,pVar77._8_8_);
                                  }
                                }
                                pcVar48 = c2m_ctx->options;
                                if (c2m_ctx->n_errors <= local_19c) {
                                  if (pcVar48->debug_p != 0) {
                                    print_node(c2m_ctx,pcVar48->message_file,r,0,1);
                                    pcVar48 = c2m_ctx->options;
                                  }
                                  if ((pcVar48->verbose_p != 0) &&
                                     (pFVar3 = (FILE *)pcVar48->message_file, pFVar3 != (FILE *)0x0)
                                     ) {
                                    dVar76 = real_usec_time();
                                    fprintf(pFVar3,"  C2MIR context checker end -- %.0f usec\n",
                                            dVar76 - dVar75);
                                    pcVar48 = c2m_ctx->options;
                                  }
                                  sprintf(c2m_ctx->temp_str_buff,"M%ld",pcVar48->module_num);
                                  module = MIR_new_module(ctx,c2m_ctx->temp_str_buff);
                                  pMVar6 = c2m_ctx->ctx;
                                  pgVar49 = (gen_ctx_conflict *)c2mir_calloc(c2m_ctx,0x1c0);
                                  c2m_ctx->gen_ctx = pgVar49;
                                  MIR_new_int_op(pMVar6,0);
                                  macro.params = (VARR_token_t *)tab_m;
                                  macro.replacement = pVStack_e0;
                                  macro._24_8_ = iStack_d8;
                                  (pgVar49->zero_op).decl = (decl_t)0x0;
                                  *(token_t *)&(pgVar49->zero_op).field_0x8 = macro.id;
                                  (pgVar49->zero_op).mir_op.data = tab_m;
                                  *(VARR_token_t **)&(pgVar49->zero_op).mir_op.field_0x8 =
                                       pVStack_e0;
                                  (pgVar49->zero_op).mir_op.u.i = iStack_d8;
                                  (pgVar49->zero_op).mir_op.u.i = iStack_d8;
                                  (pgVar49->zero_op).mir_op.u.str.s = pcStack_d0;
                                  *(undefined8 *)((long)&(pgVar49->zero_op).mir_op.u + 0x10) =
                                       uStack_c8;
                                  (pgVar49->zero_op).mir_op.u.mem.disp = MStack_c0;
                                  MIR_new_int_op(pMVar6,1);
                                  macro.params = (VARR_token_t *)t;
                                  macro.replacement = pVStack_b0;
                                  macro._24_8_ = iStack_a8;
                                  (pgVar49->one_op).decl = (decl_t)0x0;
                                  *(token_t *)&(pgVar49->one_op).field_0x8 = macro.id;
                                  (pgVar49->one_op).mir_op.data = (void *)t;
                                  *(VARR_token_t **)&(pgVar49->one_op).mir_op.field_0x8 = pVStack_b0
                                  ;
                                  (pgVar49->one_op).mir_op.u.i = iStack_a8;
                                  (pgVar49->one_op).mir_op.u.i = iStack_a8;
                                  (pgVar49->one_op).mir_op.u.str.s = pcStack_a0;
                                  *(undefined8 *)((long)&(pgVar49->one_op).mir_op.u + 0x10) =
                                       uStack_98;
                                  (pgVar49->one_op).mir_op.u.mem.disp = MStack_90;
                                  MIR_new_int_op(pMVar6,-1);
                                  macro.params = (VARR_token_t *)time_loc;
                                  macro.replacement = pVStack_60;
                                  macro._24_8_ = iStack_58;
                                  (pgVar49->minus_one_op).decl = (decl_t)0x0;
                                  *(token_t *)&(pgVar49->minus_one_op).field_0x8 = macro.id;
                                  (pgVar49->minus_one_op).mir_op.data = (void *)time_loc;
                                  *(VARR_token_t **)&(pgVar49->minus_one_op).mir_op.field_0x8 =
                                       pVStack_60;
                                  (pgVar49->minus_one_op).mir_op.u.i = iStack_58;
                                  (pgVar49->minus_one_op).mir_op.u.i = iStack_58;
                                  (pgVar49->minus_one_op).mir_op.u.str.s = pcStack_50;
                                  *(undefined8 *)((long)&(pgVar49->minus_one_op).mir_op.u + 0x10) =
                                       uStack_48;
                                  (pgVar49->minus_one_op).mir_op.u.mem.disp = MStack_40;
                                  pgVar7 = c2m_ctx->gen_ctx;
                                  pgVar7->reg_free_mark = 0;
                                  pcVar41 = (char *)0x40;
                                  pHVar50 = (HTAB_reg_var_t *)malloc(0x40);
                                  if (pHVar50 == (HTAB_reg_var_t *)0x0) goto LAB_0014bcef;
                                  pcVar41 = &DAT_00000018;
                                  pVVar51 = (VARR_HTAB_EL_reg_var_t *)malloc(0x18);
                                  pHVar50->els = pVVar51;
                                  if (pVVar51 != (VARR_HTAB_EL_reg_var_t *)0x0) {
                                    pVVar51->els_num = 0;
                                    pVVar51->size = 0x80;
                                    pHVar52 = (HTAB_EL_reg_var_t *)malloc(0xc00);
                                    pVVar51->varr = pHVar52;
                                    VARR_HTAB_EL_reg_var_ttailor(pVVar51,0x80);
                                    uVar71 = 0x100;
                                    VARR_htab_ind_tcreate(&pHVar50->entries,0x100);
                                    pHVar50->arg = (void *)0x0;
                                    iVar12 = 0x100;
                                    pHVar50->hash_func = reg_var_hash;
                                    pHVar50->eq_func = reg_var_eq;
                                    pHVar50->free_func = (_func_void_reg_var_t_void_ptr *)0x0;
                                    pHVar50->els_num = 0;
                                    pHVar50->els_start = 0;
                                    pHVar50->els_bound = 0;
                                    pHVar50->collisions = 0;
                                    while (bVar74 = iVar12 != 0, iVar12 = iVar12 + -1, bVar74) {
                                      VARR_htab_ind_tpush(pHVar50->entries,(htab_ind_t)uVar71);
                                    }
                                    pgVar7->reg_var_tab = pHVar50;
                                    pcVar41 = &DAT_00000018;
                                    pVVar53 = (VARR_MIR_var_t *)malloc(0x18);
                                    (pgVar49->proto_info).arg_vars = pVVar53;
                                    if (pVVar53 != (VARR_MIR_var_t *)0x0) {
                                      pVVar53->els_num = 0;
                                      pVVar53->size = 0x20;
                                      pMVar54 = (MIR_var_t *)malloc(0x300);
                                      pVVar53->varr = pMVar54;
                                      pcVar41 = &DAT_00000018;
                                      pVVar55 = (VARR_MIR_type_t *)malloc(0x18);
                                      (pgVar49->proto_info).ret_types = pVVar55;
                                      if (pVVar55 != (VARR_MIR_type_t *)0x0) {
                                        pVVar55->els_num = 0;
                                        pVVar55->size = 0x10;
                                        pcVar41 = (char *)0x40;
                                        pMVar56 = (MIR_type_t *)malloc(0x40);
                                        pVVar55->varr = pMVar56;
                                        pgVar7 = c2m_ctx->gen_ctx;
                                        pgVar7->curr_mir_proto_num = 0;
                                        pHVar57 = (HTAB_MIR_item_t *)malloc(0x40);
                                        if (pHVar57 == (HTAB_MIR_item_t *)0x0) goto LAB_0014bcef;
                                        pcVar41 = &DAT_00000018;
                                        pVVar58 = (VARR_HTAB_EL_MIR_item_t *)malloc(0x18);
                                        pHVar57->els = pVVar58;
                                        if (pVVar58 != (VARR_HTAB_EL_MIR_item_t *)0x0) {
                                          pVVar58->els_num = 0;
                                          pVVar58->size = 0x200;
                                          pHVar59 = (HTAB_EL_MIR_item_t *)malloc(0x2000);
                                          pVVar58->varr = pHVar59;
                                          VARR_HTAB_EL_MIR_item_ttailor(pVVar58,0x200);
                                          uVar71 = 0x400;
                                          VARR_htab_ind_tcreate(&pHVar57->entries,0x400);
                                          ppVVar73 = local_180;
                                          pHVar57->arg = (void *)0x0;
                                          iVar12 = 0x400;
                                          pHVar57->hash_func = proto_hash;
                                          pHVar57->eq_func = proto_eq;
                                          pHVar57->free_func = (_func_void_MIR_item_t_void_ptr *)0x0
                                          ;
                                          pHVar57->els_num = 0;
                                          pHVar57->els_start = 0;
                                          pHVar57->els_bound = 0;
                                          pHVar57->collisions = 0;
                                          while (bVar74 = iVar12 != 0, iVar12 = iVar12 + -1, bVar74)
                                          {
                                            VARR_htab_ind_tpush(pHVar57->entries,(htab_ind_t)uVar71)
                                            ;
                                          }
                                          pgVar7->proto_tab = pHVar57;
                                          for (uVar67 = 0; sVar44 = VARR_node_tlength(*ppVVar73),
                                              uVar67 < sVar44; uVar67 = uVar67 + 1) {
                                            pnVar33 = VARR_node_tget(*ppVVar73,uVar67);
                                            if (pnVar33->code != N_CALL) {
                                              __assert_fail("call->code == N_CALL",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                                  ,0x34cb,"void gen_mir_protos(c2m_ctx_t)");
                                            }
                                            pnVar69 = (pnVar33->u).ops.head;
                                            if ((pnVar69->code == N_ID) &&
                                               (iVar12 = strcmp((pnVar69->u).s.s,"__builtin_jcall"),
                                               iVar12 == 0)) {
                                              pnVar69 = (node_t)(((pnVar69->op_link).next)->u).l;
                                            }
                                            type = *(type **)((long)pnVar69->attr + 0x18);
                                            if ((type->mode != TM_PTR) ||
                                               (((type->u).ptr_type)->mode != TM_FUNC)) {
                                              __assert_fail(
                                                  "type->mode == TM_PTR && type->u.ptr_type->mode == TM_FUNC"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                                  ,0x34d2,"void gen_mir_protos(c2m_ctx_t)");
                                            }
                                            set_type_layout(c2m_ctx,type);
                                            func_type = *(func_type **)((type->u).tag_type + 1);
                                            if (func_type->param_list->code != N_LIST) {
                                              __assert_fail("func_type->param_list->code == N_LIST",
                                                                                                                        
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                                                  ,0x34d5,"void gen_mir_protos(c2m_ctx_t)");
                                            }
                                            collect_args_and_func_types(c2m_ctx,func_type);
                                            bVar74 = true;
                                            if ((undefined1  [32])
                                                ((undefined1  [32])*func_type &
                                                (undefined1  [32])0x1) == (undefined1  [32])0x0) {
                                              bVar74 = (func_type->param_list->u).s.s == (char *)0x0
                                              ;
                                            }
                                            pgVar8 = c2m_ctx->gen_ctx;
                                            sVar44 = VARR_MIR_type_tlength
                                                               ((pgVar8->proto_info).ret_types);
                                            pMVar56 = VARR_MIR_type_taddr((pgVar8->proto_info).
                                                                          ret_types);
                                            iVar12 = HTAB_MIR_item_t_do(pgVar8->proto_tab,
                                                                        (MIR_item_t)&macro,HTAB_FIND
                                                                        ,&el);
                                            if (iVar12 == 0) {
                                              pgVar8->curr_mir_proto_num =
                                                   pgVar8->curr_mir_proto_num + 1;
                                              sprintf(local_88,"proto%d");
                                              pcVar60 = MIR_new_vararg_proto_arr;
                                              if (!bVar74) {
                                                pcVar60 = MIR_new_proto_arr;
                                              }
                                              pMVar6 = c2m_ctx->ctx;
                                              sVar61 = VARR_MIR_var_tlength
                                                                 ((pgVar8->proto_info).arg_vars);
                                              pMVar54 = VARR_MIR_var_taddr((pgVar8->proto_info).
                                                                           arg_vars);
                                              el = (MIR_item *)
                                                   (*pcVar60)(pMVar6,local_88,(int)sVar44,pMVar56,
                                                              sVar61,pMVar54);
                                              HTAB_MIR_item_t_do(pgVar8->proto_tab,el,HTAB_INSERT,
                                                                 &el);
                                              ppVVar73 = local_180;
                                            }
                                            func_type->proto_item = el;
                                          }
                                          pHVar57 = pgVar7->proto_tab;
                                          if (pHVar57->free_func !=
                                              (_func_void_MIR_item_t_void_ptr *)0x0) {
                                            pvVar9 = pHVar57->arg;
                                            pHVar59 = VARR_HTAB_EL_MIR_item_taddr(pHVar57->els);
                                            VARR_HTAB_EL_MIR_item_tlength(pHVar57->els);
                                            ppMVar70 = &pHVar59->el;
                                            for (uVar67 = 0; uVar67 < pHVar57->els_bound;
                                                uVar67 = uVar67 + 1) {
                                              if (((HTAB_EL_MIR_item_t *)(ppMVar70 + -1))->hash != 0
                                                 ) {
                                                (*pHVar57->free_func)(*ppMVar70,pvVar9);
                                              }
                                              ppMVar70 = ppMVar70 + 2;
                                            }
                                            pHVar57->els_bound = 0;
                                            pHVar57->els_num = 0;
                                            pHVar57->els_start = 0;
                                            phVar62 = VARR_htab_ind_taddr(pHVar57->entries);
                                            sVar44 = VARR_htab_ind_tlength(pHVar57->entries);
                                            for (uVar67 = 0; (sVar44 & 0xffffffff) != uVar67;
                                                uVar67 = uVar67 + 1) {
                                              phVar62[uVar67] = 0xffffffff;
                                            }
                                            pHVar57 = pgVar7->proto_tab;
                                          }
                                          pVVar58 = pHVar57->els;
                                          if ((pVVar58 == (VARR_HTAB_EL_MIR_item_t *)0x0) ||
                                             (pVVar58->varr == (HTAB_EL_MIR_item_t *)0x0)) {
                                            mir_varr_assert_fail("destroy","HTAB_EL_MIR_item_t");
                                          }
                                          free(pVVar58->varr);
                                          free(pVVar58);
                                          pHVar57->els = (VARR_HTAB_EL_MIR_item_t *)0x0;
                                          VARR_htab_ind_tdestroy(&pgVar7->proto_tab->entries);
                                          free(pgVar7->proto_tab);
                                          pgVar7->proto_tab = (HTAB_MIR_item_t *)0x0;
                                          VARR_MIR_op_tcreate(&pgVar49->call_ops,0x20);
                                          VARR_MIR_op_tcreate(&pgVar49->ret_ops,8);
                                          VARR_MIR_op_tcreate(&pgVar49->switch_ops,0x80);
                                          pcVar41 = &DAT_00000018;
                                          pVVar63 = (VARR_case_t *)malloc(0x18);
                                          pgVar49->switch_cases = pVVar63;
                                          if (pVVar63 != (VARR_case_t *)0x0) {
                                            pVVar63->els_num = 0;
                                            pVVar63->size = 0x40;
                                            ppcVar64 = (case_t_conflict *)malloc(0x200);
                                            pVVar63->varr = ppcVar64;
                                            pcVar41 = &DAT_00000018;
                                            pVVar65 = (VARR_init_el_t *)malloc(0x18);
                                            pgVar49->init_els = pVVar65;
                                            if (pVVar65 != (VARR_init_el_t *)0x0) {
                                              pVVar65->els_num = 0;
                                              pVVar65->size = 0x80;
                                              piVar66 = (init_el_t *)malloc(0x1c00);
                                              pVVar65->varr = piVar66;
                                              VARR_node_tcreate(&pgVar49->node_stack,8);
                                              pgVar49->memset_proto = (MIR_item_t)0x0;
                                              pgVar49->memset_item = (MIR_item_t)0x0;
                                              pgVar49->memcpy_proto = (MIR_item_t)0x0;
                                              pgVar49->memcpy_item = (MIR_item_t)0x0;
                                              top_gen(c2m_ctx,r,(MIR_label_t)0x0,(MIR_label_t)0x0,
                                                      (int *)0x0);
                                              pgVar7 = c2m_ctx->gen_ctx;
                                              if (pgVar7 != (gen_ctx_conflict *)0x0) {
                                                pHVar50 = pgVar7->reg_var_tab;
                                                if (pHVar50 != (HTAB_reg_var_t *)0x0) {
                                                  if (pHVar50->free_func !=
                                                      (_func_void_reg_var_t_void_ptr *)0x0) {
                                                    HTAB_reg_var_t_clear(pHVar50);
                                                    pHVar50 = pgVar7->reg_var_tab;
                                                  }
                                                  pVVar51 = pHVar50->els;
                                                  if ((pVVar51 == (VARR_HTAB_EL_reg_var_t *)0x0) ||
                                                     (pVVar51->varr == (HTAB_EL_reg_var_t *)0x0)) {
                                                    mir_varr_assert_fail
                                                              ("destroy","HTAB_EL_reg_var_t");
                                                  }
                                                  free(pVVar51->varr);
                                                  free(pVVar51);
                                                  pHVar50->els = (VARR_HTAB_EL_reg_var_t *)0x0;
                                                  VARR_htab_ind_tdestroy
                                                            (&pgVar7->reg_var_tab->entries);
                                                  free(pgVar7->reg_var_tab);
                                                  pgVar7->reg_var_tab = (HTAB_reg_var_t *)0x0;
                                                }
                                                pVVar53 = (pgVar7->proto_info).arg_vars;
                                                if (pVVar53 != (VARR_MIR_var_t *)0x0) {
                                                  if (pVVar53->varr == (MIR_var_t *)0x0) {
                                                    mir_varr_assert_fail("destroy","MIR_var_t");
                                                  }
                                                  free(pVVar53->varr);
                                                  free(pVVar53);
                                                  (pgVar7->proto_info).arg_vars =
                                                       (VARR_MIR_var_t *)0x0;
                                                }
                                                pVVar55 = (pgVar7->proto_info).ret_types;
                                                if (pVVar55 != (VARR_MIR_type_t *)0x0) {
                                                  if (pVVar55->varr == (MIR_type_t *)0x0) {
                                                    mir_varr_assert_fail("destroy","MIR_type_t");
                                                  }
                                                  free(pVVar55->varr);
                                                  free(pVVar55);
                                                  (pgVar7->proto_info).ret_types =
                                                       (VARR_MIR_type_t *)0x0;
                                                }
                                                if (pgVar7->call_ops != (VARR_MIR_op_t *)0x0) {
                                                  VARR_MIR_op_tdestroy(&pgVar7->call_ops);
                                                }
                                                if (pgVar7->ret_ops != (VARR_MIR_op_t *)0x0) {
                                                  VARR_MIR_op_tdestroy(&pgVar7->ret_ops);
                                                }
                                                if (pgVar7->switch_ops != (VARR_MIR_op_t *)0x0) {
                                                  VARR_MIR_op_tdestroy(&pgVar7->switch_ops);
                                                }
                                                pVVar63 = pgVar7->switch_cases;
                                                if (pVVar63 != (VARR_case_t *)0x0) {
                                                  if (pVVar63->varr == (case_t_conflict *)0x0) {
                                                    mir_varr_assert_fail("destroy","case_t");
                                                  }
                                                  free(pVVar63->varr);
                                                  free(pVVar63);
                                                  pgVar7->switch_cases = (VARR_case_t *)0x0;
                                                }
                                                pVVar65 = pgVar7->init_els;
                                                if (pVVar65 != (VARR_init_el_t *)0x0) {
                                                  if (pVVar65->varr == (init_el_t *)0x0) {
                                                    mir_varr_assert_fail("destroy","init_el_t");
                                                  }
                                                  free(pVVar65->varr);
                                                  free(pVVar65);
                                                  pgVar7->init_els = (VARR_init_el_t *)0x0;
                                                }
                                                if (pgVar7->node_stack != (VARR_node_t *)0x0) {
                                                  VARR_node_tdestroy(&pgVar7->node_stack);
                                                }
                                                free(c2m_ctx->gen_ctx);
                                              }
                                              pcVar48 = c2m_ctx->options;
                                              iVar12 = pcVar48->asm_p;
                                              if (((iVar12 != 0) || (pcVar48->object_p != 0)) &&
                                                 (c2m_ctx->n_errors == 0)) {
                                                iVar13 = strcmp(source_name,"<command-line>");
                                                if (iVar13 == 0) {
                                                  MIR_output_module(ctx,pcVar48->message_file,module
                                                                   );
                                                }
                                                else if (output_file != (FILE *)0x0) {
                                                  if (iVar12 == 0) {
                                                    pcVar60 = MIR_write_module;
                                                  }
                                                  else {
                                                    pcVar60 = MIR_output_module;
                                                  }
                                                  (*pcVar60)(ctx,output_file,module);
                                                  iVar12 = ferror((FILE *)output_file);
                                                  if ((iVar12 != 0) ||
                                                     (iVar12 = fclose((FILE *)output_file),
                                                     iVar12 != 0)) {
                                                    fprintf((FILE *)c2m_ctx->options->message_file,
                                                                                                                        
                                                  "C2MIR error in writing mir for source file %s\n",
                                                  source_name);
                                                  c2m_ctx->n_errors = c2m_ctx->n_errors + 1;
                                                  }
                                                }
                                              }
                                              MIR_finish_module(ctx);
                                              if ((c2m_ctx->options->verbose_p != 0) &&
                                                 (pFVar3 = (FILE *)c2m_ctx->options->message_file,
                                                 pFVar3 != (FILE *)0x0)) {
                                                dVar76 = real_usec_time();
                                                fprintf(pFVar3,
                                                  "  C2MIR generator end       -- %.0f usec\n",
                                                  dVar76 - dVar75);
                                              }
                                              goto LAB_0014b0fe;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  goto LAB_0014bccb;
                                }
                                if (pcVar48->debug_p != 0) {
                                  print_node(c2m_ctx,pcVar48->message_file,r,0,0);
                                  pcVar48 = c2m_ctx->options;
                                }
                                if ((pcVar48->verbose_p != 0) &&
                                   ((FILE *)pcVar48->message_file != (FILE *)0x0)) {
                                  fwrite("C2MIR context checker - FAIL\n",0x1d,1,
                                         (FILE *)pcVar48->message_file);
                                }
                              }
                            }
LAB_0014b0fe:
                            compile_finish(c2m_ctx);
                            if ((c2m_ctx->options->verbose_p != 0) &&
                               (pFVar3 = (FILE *)c2m_ctx->options->message_file,
                               pFVar3 != (FILE *)0x0)) {
                              dVar76 = real_usec_time();
                              fprintf(pFVar3,"C2MIR compiler end                -- %.0f usec\n",
                                      dVar76 - dVar75);
                            }
                            return (uint)(c2m_ctx->n_errors == 0);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_0014bccb:
      mir_varr_error(pcVar41);
    }
    compile_finish(c2m_ctx);
  }
  return 0;
}

Assistant:

int c2mir_compile (MIR_context_t ctx, struct c2mir_options *ops, int (*getc_func) (void *),
                   void *getc_data, const char *source_name, FILE *output_file) {
  struct c2m_ctx *c2m_ctx = *c2m_ctx_loc (ctx);
  double start_time = real_usec_time ();
  node_t r;
  unsigned n_error_before;
  MIR_module_t m;

  if (c2m_ctx == NULL) return 0;
  if (setjmp (c2m_ctx->env)) {
    compile_finish (c2m_ctx);
    return 0;
  }
  compile_init (c2m_ctx, ops, getc_func, getc_data);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "C2MIR init end           -- %.0f usec\n",
             real_usec_time () - start_time);
  add_stream (c2m_ctx, NULL, source_name, top_level_getc);
  if (!c2m_options->no_prepro_p) add_standard_includes (c2m_ctx);
  pre (c2m_ctx);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "  C2MIR preprocessor end    -- %.0f usec\n",
             real_usec_time () - start_time);
  if (!c2m_options->prepro_only_p) {
    r = parse (c2m_ctx);
    if (c2m_options->verbose_p && c2m_options->message_file != NULL)
      fprintf (c2m_options->message_file, "  C2MIR parser end          -- %.0f usec\n",
               real_usec_time () - start_time);
    if (c2m_options->verbose_p && c2m_options->message_file != NULL && n_errors)
      fprintf (c2m_options->message_file, "parser - FAIL\n");
    if (!c2m_options->syntax_only_p) {
      n_error_before = n_errors;
      do_context (c2m_ctx, r);
      if (n_errors > n_error_before) {
        if (c2m_options->debug_p) print_node (c2m_ctx, c2m_options->message_file, r, 0, FALSE);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "C2MIR context checker - FAIL\n");
      } else {
        if (c2m_options->debug_p) print_node (c2m_ctx, c2m_options->message_file, r, 0, TRUE);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "  C2MIR context checker end -- %.0f usec\n",
                   real_usec_time () - start_time);
        m = MIR_new_module (ctx, get_module_name (c2m_ctx));
        gen_mir (c2m_ctx, r);
        if ((c2m_options->asm_p || c2m_options->object_p) && n_errors == 0) {
          if (strcmp (source_name, COMMAND_LINE_SOURCE_NAME) == 0) {
            MIR_output_module (ctx, c2m_options->message_file, m);
          } else if (output_file != NULL) {
            (c2m_options->asm_p ? MIR_output_module : MIR_write_module) (ctx, output_file, m);
            if (ferror (output_file) || fclose (output_file)) {
              fprintf (c2m_options->message_file, "C2MIR error in writing mir for source file %s\n",
                       source_name);
              n_errors++;
            }
          }
        }
        MIR_finish_module (ctx);
        if (c2m_options->verbose_p && c2m_options->message_file != NULL)
          fprintf (c2m_options->message_file, "  C2MIR generator end       -- %.0f usec\n",
                   real_usec_time () - start_time);
      }
    }
  }
  compile_finish (c2m_ctx);
  if (c2m_options->verbose_p && c2m_options->message_file != NULL)
    fprintf (c2m_options->message_file, "C2MIR compiler end                -- %.0f usec\n",
             real_usec_time () - start_time);
  return n_errors == 0;
}